

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::CTestFileExists(cmCTest *this,string *filename)

{
  bool bVar1;
  char *filename_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string testingDir;
  string *filename_local;
  cmCTest *this_local;
  
  testingDir.field_2._8_8_ = filename;
  std::operator+(&local_98,&this->BinaryDir,"/Testing/");
  std::operator+(&local_78,&local_98,&this->CurrentTag);
  std::operator+(&local_58,&local_78,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 testingDir.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  filename_00 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(filename_00);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool cmCTest::CTestFileExists(const std::string& filename)
{
  std::string testingDir =
    this->BinaryDir + "/Testing/" + this->CurrentTag + "/" + filename;
  return cmSystemTools::FileExists(testingDir.c_str());
}